

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePop(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint *puVar4;
  float unaff_retaddr;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  Unindent(unaff_retaddr);
  (pIVar1->DC).TreeDepth = (pIVar1->DC).TreeDepth + -1;
  if ((((pIVar2->NavMoveDir == 0) && (pIVar2->NavWindow == pIVar1)) &&
      (bVar3 = NavMoveRequestButNoResultYet(), bVar3)) &&
     (((pIVar2->NavIdIsAlive & 1U) != 0 &&
      (((pIVar1->DC).TreeDepthMayJumpToParentOnPop & 1 << ((byte)(pIVar1->DC).TreeDepth & 0x1f)) !=
       0)))) {
    puVar4 = ImVector<unsigned_int>::back(&pIVar1->IDStack);
    SetNavID(*puVar4,pIVar2->NavLayer);
    NavMoveRequestCancel();
  }
  (pIVar1->DC).TreeDepthMayJumpToParentOnPop =
       (1 << ((byte)(pIVar1->DC).TreeDepth & 0x1f)) - 1U &
       (pIVar1->DC).TreeDepthMayJumpToParentOnPop;
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeDepthMayJumpToParentOnPop & (1 << window->DC.TreeDepth)))
        {
            SetNavID(window->IDStack.back(), g.NavLayer);
            NavMoveRequestCancel();
        }
    window->DC.TreeDepthMayJumpToParentOnPop &= (1 << window->DC.TreeDepth) - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}